

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O2

aom_codec_err_t encoder_set_config(aom_codec_alg_priv_t_conflict *ctx,aom_codec_enc_cfg_t *cfg)

{
  AV1EncoderConfig *oxcf;
  char cVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  AV1_COMP *pAVar7;
  AV1_PRIMARY *pAVar8;
  aom_codec_err_t aVar9;
  ulong in_RAX;
  char *pcVar10;
  bool bVar11;
  int i;
  long lVar12;
  ulong uStack_38;
  _Bool is_sb_size_changed;
  
  uVar3 = cfg->g_w;
  if ((uVar3 != (ctx->cfg).g_w) || (bVar11 = false, cfg->g_h != (ctx->cfg).g_h)) {
    if ((1 < cfg->g_lag_in_frames) || (cfg->g_pass != AOM_RC_ONE_PASS)) {
      pcVar10 = "Cannot change width or height after initialization";
      goto LAB_00180579;
    }
    pAVar7 = ctx->ppi->cpi;
    bVar11 = false;
    if ((((pAVar7->svc).number_spatial_layers == 1) &&
        (iVar4 = pAVar7->last_coded_width, bVar11 = false, iVar4 != 0)) &&
       (iVar5 = pAVar7->last_coded_height, iVar5 != 0)) {
      uVar6 = cfg->g_h;
      bVar11 = iVar5 < (int)uVar6 ||
               ((iVar4 < (int)uVar3 || iVar5 * 0x10 < (int)uVar6) ||
               (iVar4 * 0x10 < (int)uVar3 || ((int)(uVar6 * 2) < iVar5 || (int)(uVar3 * 2) < iVar4))
               );
    }
  }
  if ((ctx->monochrome_on_init == true) && (cfg->monochrome == 0)) {
    pcVar10 = "Cannot change to monochrome = 0 after init with monochrome";
  }
  else {
    uVar3 = (ctx->cfg).g_lag_in_frames;
    if (uVar3 < cfg->g_lag_in_frames) {
      pcVar10 = "Cannot increase lag_in_frames";
    }
    else {
      if ((cfg->g_lag_in_frames == uVar3) || (ctx->num_lap_buffers < 1)) {
        uStack_38 = in_RAX;
        aVar9 = validate_config(ctx,cfg,&ctx->extra_cfg);
        if (aVar9 == AOM_CODEC_OK) {
          memcpy(&ctx->cfg,cfg,0x388);
          oxcf = &ctx->oxcf;
          set_encoder_config(oxcf,&ctx->cfg,&ctx->extra_cfg);
          cVar1 = (ctx->ppi->seq_params).profile;
          cVar2 = (ctx->oxcf).profile;
          uStack_38 = uStack_38 & 0xffffffffffffff;
          av1_change_config_seq(ctx->ppi,oxcf,&is_sb_size_changed);
          lVar12 = 0;
          while( true ) {
            pAVar8 = ctx->ppi;
            if (pAVar8->num_fp_contexts <= lVar12) break;
            av1_change_config(pAVar8->parallel_cpi[lVar12],oxcf,is_sb_size_changed);
            lVar12 = lVar12 + 1;
          }
          if (pAVar8->cpi_lap != (AV1_COMP *)0x0) {
            av1_change_config(pAVar8->cpi_lap,oxcf,is_sb_size_changed);
          }
          bVar11 = (bool)(bVar11 | cVar1 != cVar2);
        }
        if (!bVar11) {
          return aVar9;
        }
        *(byte *)&ctx->next_frame_flags = (byte)ctx->next_frame_flags | 1;
        return aVar9;
      }
      pcVar10 = "Cannot change lag_in_frames if LAP is enabled";
    }
  }
LAB_00180579:
  (ctx->base).err_detail = pcVar10;
  return AOM_CODEC_INVALID_PARAM;
}

Assistant:

static aom_codec_err_t encoder_set_config(aom_codec_alg_priv_t *ctx,
                                          const aom_codec_enc_cfg_t *cfg) {
  aom_codec_err_t res;
  int force_key = 0;

  if (cfg->g_w != ctx->cfg.g_w || cfg->g_h != ctx->cfg.g_h) {
    if (cfg->g_lag_in_frames > 1 || cfg->g_pass != AOM_RC_ONE_PASS)
      ERROR("Cannot change width or height after initialization");
    // Note: function encoder_set_config() is allowed to be called multiple
    // times. However, when the original frame width or height is less than two
    // times of the new frame width or height, a forced key frame should be
    // used (for the case of single spatial layer, since otherwise a previous
    // encoded frame at a lower layer may be the desired reference). To make
    // sure the correct detection of a forced key frame, we need
    // to update the frame width and height only when the actual encoding is
    // performed. cpi->last_coded_width and cpi->last_coded_height are used to
    // track the actual coded frame size.
    if (ctx->ppi->cpi->svc.number_spatial_layers == 1 &&
        ctx->ppi->cpi->last_coded_width && ctx->ppi->cpi->last_coded_height &&
        (!valid_ref_frame_size(ctx->ppi->cpi->last_coded_width,
                               ctx->ppi->cpi->last_coded_height, cfg->g_w,
                               cfg->g_h) ||
         ((int)cfg->g_w > ctx->ppi->cpi->last_coded_width) ||
         ((int)cfg->g_h > ctx->ppi->cpi->last_coded_height))) {
      force_key = 1;
    }
  }

  if (ctx->monochrome_on_init && cfg->monochrome == 0) {
    // TODO(aomedia:3465): Allow this case to work without requiring re-init
    // of encoder.
    ERROR("Cannot change to monochrome = 0 after init with monochrome");
  }

  // Prevent increasing lag_in_frames. This check is stricter than it needs
  // to be -- the limit is not increasing past the first lag_in_frames
  // value, but we don't track the initial config, only the last successful
  // config.
  if (cfg->g_lag_in_frames > ctx->cfg.g_lag_in_frames)
    ERROR("Cannot increase lag_in_frames");
  // Prevent changing lag_in_frames if Lookahead Processing is enabled
  if (cfg->g_lag_in_frames != ctx->cfg.g_lag_in_frames &&
      ctx->num_lap_buffers > 0)
    ERROR("Cannot change lag_in_frames if LAP is enabled");

  res = validate_config(ctx, cfg, &ctx->extra_cfg);

  if (res == AOM_CODEC_OK) {
    ctx->cfg = *cfg;
    set_encoder_config(&ctx->oxcf, &ctx->cfg, &ctx->extra_cfg);
    // On profile change, request a key frame
    force_key |= ctx->ppi->seq_params.profile != ctx->oxcf.profile;
    bool is_sb_size_changed = false;
    av1_change_config_seq(ctx->ppi, &ctx->oxcf, &is_sb_size_changed);
    for (int i = 0; i < ctx->ppi->num_fp_contexts; i++) {
      av1_change_config(ctx->ppi->parallel_cpi[i], &ctx->oxcf,
                        is_sb_size_changed);
    }
    if (ctx->ppi->cpi_lap != NULL) {
      av1_change_config(ctx->ppi->cpi_lap, &ctx->oxcf, is_sb_size_changed);
    }
  }

  if (force_key) ctx->next_frame_flags |= AOM_EFLAG_FORCE_KF;

  return res;
}